

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O0

ON_Localizer * __thiscall ON_Localizer::operator=(ON_Localizer *this,ON_Localizer *src)

{
  ON_NurbsCurve *pOVar1;
  ON_NurbsSurface *pOVar2;
  ON_Localizer *src_local;
  ON_Localizer *this_local;
  
  if (this != src) {
    Destroy(this);
    this->m_type = src->m_type;
    (this->m_d).m_t[0] = (src->m_d).m_t[0];
    (this->m_d).m_t[1] = (src->m_d).m_t[1];
    (this->m_P).x = (src->m_P).x;
    (this->m_P).y = (src->m_P).y;
    (this->m_P).z = (src->m_P).z;
    (this->m_V).x = (src->m_V).x;
    (this->m_V).y = (src->m_V).y;
    (this->m_V).z = (src->m_V).z;
    if (src->m_nurbs_curve != (ON_NurbsCurve *)0x0) {
      pOVar1 = ON_NurbsCurve::Duplicate(src->m_nurbs_curve);
      this->m_nurbs_curve = pOVar1;
    }
    if (src->m_nurbs_surface != (ON_NurbsSurface *)0x0) {
      pOVar2 = ON_NurbsSurface::Duplicate(src->m_nurbs_surface);
      this->m_nurbs_surface = pOVar2;
    }
  }
  return this;
}

Assistant:

ON_Localizer& ON_Localizer::operator=(const ON_Localizer& src)
{
  if ( this != &src )
  {
    Destroy();
    m_type = src.m_type;
    m_d = src.m_d;
    m_P = src.m_P;
    m_V = src.m_V;
    if ( src.m_nurbs_curve )
      m_nurbs_curve = src.m_nurbs_curve->Duplicate();
    if ( src.m_nurbs_surface )
      m_nurbs_surface = src.m_nurbs_surface->Duplicate();
  }
  return *this;
}